

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UpsampleLayerParams::InternalSwap
          (UpsampleLayerParams *this,UpsampleLayerParams *other)

{
  UpsampleLayerParams *other_local;
  UpsampleLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->scalingfactor_,&other->scalingfactor_);
  google::protobuf::RepeatedField<float>::InternalSwap
            (&this->fractionalscalingfactor_,&other->fractionalscalingfactor_);
  std::swap<int>(&this->mode_,&other->mode_);
  std::swap<int>(&this->linearupsamplemode_,&other->linearupsamplemode_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void UpsampleLayerParams::InternalSwap(UpsampleLayerParams* other) {
  scalingfactor_.InternalSwap(&other->scalingfactor_);
  fractionalscalingfactor_.InternalSwap(&other->fractionalscalingfactor_);
  std::swap(mode_, other->mode_);
  std::swap(linearupsamplemode_, other->linearupsamplemode_);
  std::swap(_cached_size_, other->_cached_size_);
}